

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

void read1_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  long lVar1;
  undefined8 uVar2;
  char *__format;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  if (tcp == (uv_stream_t *)0x0) {
    pcVar4 = "!=";
    eval_b = 0;
    pcVar6 = "!=";
    eval_a = 0;
    pcVar5 = "NULL";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar3 = "tcp";
    uVar2 = 0x81;
  }
  else {
    if (nread < 0) {
      eval_b = -0xfff;
      if (nread == -0xfff) {
        puts("GOT EOF");
        uv_close(tcp,close_cb);
        return;
      }
      pcVar5 = "UV_EOF";
      pcVar3 = "nread";
      uVar2 = 0x87;
      eval_a = nread;
    }
    else {
      lVar1 = 0;
      while( true ) {
        if (nread == lVar1) {
          return;
        }
        eval_a = (int64_t)buf->base[lVar1];
        eval_b = 0x50;
        if (eval_a != 0x50) break;
        lVar1 = lVar1 + 1;
      }
      pcVar5 = "\'P\'";
      pcVar3 = "buf->base[i]";
      uVar2 = 0x85;
    }
    pcVar4 = "==";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar6 = "==";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-open.c"
          ,uVar2,pcVar3,pcVar4,pcVar5,eval_a,pcVar6,eval_b);
  abort();
}

Assistant:

static void read1_cb(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  int i;
  ASSERT_NOT_NULL(tcp);

  if (nread >= 0) {
    for (i = 0; i < nread; ++i)
      ASSERT_EQ(buf->base[i], 'P');
  } else {
    ASSERT_EQ(nread, UV_EOF);
    printf("GOT EOF\n");
    uv_close((uv_handle_t*)tcp, close_cb);
  }
}